

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

uint32_t mp_decode_strbinl(char **data)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  uint uVar4;
  byte *pbVar5;
  uint *in_RSI;
  
  pbVar5 = (byte *)*data;
  bVar1 = *pbVar5;
  *data = (char *)(pbVar5 + 1);
  uVar4 = (uint)bVar1;
  if (bVar1 < 0xd9) {
    if (uVar4 == 0xc4) {
LAB_0013bed5:
      bVar1 = pbVar5[1];
      *data = (char *)(pbVar5 + 2);
      return (uint32_t)bVar1;
    }
    if (bVar1 == 0xc5) {
LAB_0013beee:
      uVar2 = *(ushort *)(pbVar5 + 1);
      *data = (char *)(pbVar5 + 3);
      return (uint32_t)(ushort)(uVar2 << 8 | uVar2 >> 8);
    }
    if (bVar1 == 0xc6) goto LAB_0013bee1;
  }
  else {
    if (bVar1 == 0xdb) {
LAB_0013bee1:
      uVar4 = *(uint *)(pbVar5 + 1);
      *data = (char *)(pbVar5 + 5);
      return uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    }
    if (bVar1 == 0xda) goto LAB_0013beee;
    if (uVar4 == 0xd9) goto LAB_0013bed5;
  }
  if (0xdf < (byte)(bVar1 + 0x40)) {
    return uVar4 & 0x1f;
  }
  mp_decode_strbinl_cold_1();
  if (in_RSI == (uint *)0x0) goto LAB_0013bfa9;
  pbVar3 = (byte *)*data;
  bVar1 = *pbVar3;
  pbVar5 = pbVar3 + 1;
  *data = (char *)pbVar5;
  if (bVar1 < 0xd9) {
    if (bVar1 == 0xc4) {
LAB_0013bf64:
      uVar4 = (uint)pbVar3[1];
      pbVar5 = pbVar3 + 2;
      goto LAB_0013bf8b;
    }
    if (bVar1 == 0xc5) {
LAB_0013bf79:
      pbVar5 = pbVar3 + 3;
      uVar4 = (uint)(ushort)(*(ushort *)(pbVar3 + 1) << 8 | *(ushort *)(pbVar3 + 1) >> 8);
      goto LAB_0013bf8b;
    }
    if (bVar1 != 0xc6) {
LAB_0013bf97:
      if ((byte)(bVar1 + 0x40) < 0xe0) {
        mp_decode_strbin_cold_1();
LAB_0013bfa9:
        __assert_fail("len != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                      ,0xa9c,"const char *mp_decode_strbin(const char **, uint32_t *)");
      }
      uVar4 = bVar1 & 0x1f;
      goto LAB_0013bf8b;
    }
  }
  else if (bVar1 != 0xdb) {
    if (bVar1 == 0xda) goto LAB_0013bf79;
    if (bVar1 != 0xd9) goto LAB_0013bf97;
    goto LAB_0013bf64;
  }
  uVar4 = *(uint *)(pbVar3 + 1);
  uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  pbVar5 = pbVar3 + 5;
LAB_0013bf8b:
  *in_RSI = uVar4;
  *data = (char *)(pbVar5 + uVar4);
  return (uint32_t)pbVar5;
}

Assistant:

MP_IMPL uint32_t
mp_decode_strbinl(const char **data)
{
	uint8_t c = mp_load_u8(data);

	switch (c) {
	case 0xd9:
		return mp_load_u8(data);
	case 0xda:
		return mp_load_u16(data);
	case 0xdb:
		return mp_load_u32(data);
	case 0xc4:
		return mp_load_u8(data);
	case 0xc5:
		return mp_load_u16(data);
	case 0xc6:
		return mp_load_u32(data);
	default:
		if (mp_unlikely(c < 0xa0 || c > 0xbf))
			mp_unreachable();
		return c & 0x1f;
	}
}